

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
::Archive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
          *this,MemIOWriter *Writer)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  pointer pIVar4;
  pointer pIVar5;
  
  bVar1 = Kumu::MemIOWriter::WriteUi32BE
                    (Writer,(ui32_t)(((long)(this->
                                            super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                                            ).
                                            super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->
                                           super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                                           ).
                                           super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  if (bVar1) {
    bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,0xb);
    if (bVar1) {
      pIVar5 = (this->
               super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
               ).
               super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar4 = (this->
               super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
               ).
               super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar3 = 1;
      bVar2 = 1;
      if (pIVar5 != pIVar4) {
        for (; (bVar2 = (byte)uVar3, (uVar3 & 1) != 0 && (pIVar5 != pIVar4)); pIVar5 = pIVar5 + 1) {
          uVar3 = (*(pIVar5->super_IArchive)._vptr_IArchive[4])(pIVar5,Writer);
          pIVar4 = (this->
                   super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   ).
                   super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      goto LAB_001a1926;
    }
  }
  bVar2 = 0;
LAB_001a1926:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }